

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O2

void __thiscall Money::Money(Money *this,double money,string *currency)

{
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)this,(string *)currency);
  this->cents = 0;
  if (9.223372036854776e+18 < money * 100.0) {
    std::__cxx11::to_string(&local_30,money);
    std::operator+(&local_50,"Error in Money::Money() - \'",&local_30);
    std::operator+(&local_70,&local_50,"\' is not valid.");
    error(&local_70);
  }
  else if (currency->_M_string_length == 3) {
    this->cents = (long)(money * 100.0);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "Error in Money::Money() - Currency code must be provided according to ISO 4217.",
             (allocator<char> *)&local_50);
  error(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Money::Money(double money, const std::string& currency) : cents{ 0 }, currency{currency}
{
	if (!is_money_valid(money))
	{
		error("Error in Money::Money() - '" 
			+ std::to_string(money) + "' is not valid.");
	}
	if (currency.empty() || currency.size() != 3)
	{
		error("Error in Money::Money() - Currency code must be provided according to ISO 4217.");
	}
	cents = static_cast<long>(money * 100);
}